

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader.h
# Opt level: O2

int aom_read_symbol_(aom_reader *r,aom_cdf_prob *cdf,int nsymbs)

{
  ushort uVar1;
  ushort uVar2;
  short sVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  
  iVar4 = od_ec_decode_cdf_q15(&r->ec,cdf,nsymbs);
  if (r->allow_update_cdf != '\0') {
    uVar1 = cdf[(uint)nsymbs];
    bVar5 = (char)(uVar1 >> 4) + (3 < nsymbs) + 4;
    lVar6 = 0;
    do {
      uVar2 = cdf[lVar6];
      if (lVar6 < (char)iVar4) {
        sVar3 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar5 & 0x1f));
      }
      else {
        sVar3 = -(uVar2 >> (bVar5 & 0x1f));
      }
      cdf[lVar6] = sVar3 + uVar2;
      lVar6 = lVar6 + 1;
    } while (lVar6 < nsymbs + -1);
    cdf[(uint)nsymbs] = cdf[(uint)nsymbs] + (ushort)(uVar1 < 0x20);
  }
  return iVar4;
}

Assistant:

static inline int aom_read_symbol_(aom_reader *r, aom_cdf_prob *cdf,
                                   int nsymbs ACCT_STR_PARAM) {
  int ret;
  ret = aom_read_cdf(r, cdf, nsymbs, ACCT_STR_NAME);
  if (r->allow_update_cdf) update_cdf(cdf, ret, nsymbs);
  return ret;
}